

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O1

Vec3fa __thiscall
embree::occluded(embree *this,RTCTraversable traversable,RayQueryContext *context,Ray *ray)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 in_XMM1_Qa;
  Vec3fa VVar5;
  Vec3fa transparency;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_40;
  RayQueryContext *local_38;
  code *pcStack_30;
  undefined8 local_28;
  
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f8000003f800000;
  context->userRayExt = &local_58;
  ray->primID = 0xffffffff;
  ray->geomID = 0xffffffff;
  ray->mask = 0xffffffff;
  local_28 = 0;
  local_40 = 0x100004200000000;
  pcStack_30 = occlusionFilter;
  local_38 = context;
  rtcTraversableOccluded1(traversable,ray);
  context->userRayExt = (void *)0x0;
  uVar1 = 0;
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  if (0.0 < ray->tfar || ray->tfar == 0.0) {
    uVar1 = (undefined4)local_58;
    uVar2 = local_58._4_4_;
    uVar3 = (undefined4)uStack_50;
    uVar4 = uStack_50._4_4_;
  }
  *(undefined4 *)this = uVar1;
  *(undefined4 *)(this + 4) = uVar2;
  *(undefined4 *)(this + 8) = uVar3;
  *(undefined4 *)(this + 0xc) = uVar4;
  VVar5.field_0.m128[1] = (float)uVar2;
  VVar5.field_0.m128[0] = (float)uVar1;
  VVar5.field_0._8_8_ = in_XMM1_Qa;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa occluded(RTCTraversable traversable, RayQueryContext* context, Ray& ray)
{
  Vec3fa transparency = Vec3fa(1.0f);
  context->userRayExt = &transparency;
  
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;

  RTCOccludedArguments args;
  rtcInitOccludedArguments(&args);
  args.context = &context->context;
  args.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  args.filter = occlusionFilter;
  
  rtcTraversableOccluded1(traversable,RTCRay_(ray),&args);
  context->userRayExt = nullptr;

  if (ray.tfar < 0) return Vec3fa(0.0f);
  else              return transparency;
}